

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O0

void __thiscall llvm::APFloat::Storage::Storage(Storage *this,Storage *RHS)

{
  bool bVar1;
  Storage *RHS_local;
  Storage *this_local;
  
  bVar1 = usesLayout<llvm::detail::IEEEFloat>(RHS->semantics);
  if (bVar1) {
    detail::IEEEFloat::IEEEFloat((IEEEFloat *)this,&RHS->IEEE);
  }
  else {
    bVar1 = usesLayout<llvm::detail::DoubleAPFloat>(RHS->semantics);
    if (!bVar1) {
      llvm_unreachable_internal
                ("Unexpected semantics",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                 ,0x2d5);
    }
    detail::DoubleAPFloat::DoubleAPFloat((DoubleAPFloat *)this,(DoubleAPFloat *)&RHS->IEEE);
  }
  return;
}

Assistant:

Storage(const Storage &RHS) {
      if (usesLayout<IEEEFloat>(*RHS.semantics)) {
        new (this) IEEEFloat(RHS.IEEE);
        return;
      }
      if (usesLayout<DoubleAPFloat>(*RHS.semantics)) {
        new (this) DoubleAPFloat(RHS.Double);
        return;
      }
      llvm_unreachable("Unexpected semantics");
    }